

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O2

bool blockfilter_index_tests::CheckFilterLookups
               (BlockFilterIndex *filter_index,CBlockIndex *block_index,uint256 *last_header,
               BlockManager *blockman)

{
  long lVar1;
  pointer puVar2;
  bool bVar3;
  readonly_property<bool> rVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator pvVar6;
  iterator in_R9;
  uint256 *puVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  check_type cVar8;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  assertion_result local_218;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  vector<uint256,_std::allocator<uint256>_> filter_hashes;
  vector<BlockFilter,_std::allocator<BlockFilter>_> filters;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 local_170 [32];
  undefined1 local_150 [16];
  shared_count asStack_140 [2];
  BlockFilter filter;
  uint256 filter_header;
  BlockFilter expected_filter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BlockFilter::BlockFilter(&expected_filter);
  bVar3 = ComputeFilter(filter_index->m_filter_type,block_index,&expected_filter,blockman);
  if (bVar3) {
    BlockFilter::BlockFilter(&filter);
    filter_header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filter_header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_1e0 = "";
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x2e;
    file.m_begin = (iterator)&local_1e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1f8,msg);
    rVar4.super_class_property<bool>.value =
         (class_property<bool>)BlockFilterIndex::LookupFilter(filter_index,block_index,&filter);
    local_150._8_8_ = (element_type *)0x0;
    asStack_140[0].pi_ = (sp_counted_base *)0x0;
    local_170._0_8_ = "filter_index.LookupFilter(block_index, filter)";
    local_170._8_8_ = "";
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_0113a070;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_220 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    local_200 = local_170;
    local_150[0] = rVar4.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_150,(lazy_ostream *)&local_218,1,0,WARN,_cVar8,
               (size_t)&local_228,0x2e);
    boost::detail::shared_count::~shared_count(asStack_140);
    local_238 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_230 = "";
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    file_00.m_end = (iterator)0x2f;
    file_00.m_begin = (iterator)&local_238;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
               msg_00);
    local_150[0] = (class_property<bool>)
                   BlockFilterIndex::LookupFilterHeader(filter_index,block_index,&filter_header);
    local_150._8_8_ = (element_type *)0x0;
    asStack_140[0].pi_ = (sp_counted_base *)0x0;
    local_170._0_8_ = "filter_index.LookupFilterHeader(block_index, filter_header)";
    local_170._8_8_ = "";
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_0113a070;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_258 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_250 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    local_200 = local_170;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_150,(lazy_ostream *)&local_218,1,0,WARN,_cVar8,
               (size_t)&local_258,0x2f);
    boost::detail::shared_count::~shared_count(asStack_140);
    local_268 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_260 = "";
    local_278 = &boost::unit_test::basic_cstring<char_const>::null;
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar6;
    msg_01.m_begin = pvVar5;
    file_01.m_end = (iterator)0x30;
    file_01.m_begin = (iterator)&local_268;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
               msg_01);
    local_150[0] = (class_property<bool>)
                   BlockFilterIndex::LookupFilterRange
                             (filter_index,block_index->nHeight,block_index,&filters);
    local_150._8_8_ = (element_type *)0x0;
    asStack_140[0].pi_ = (sp_counted_base *)0x0;
    local_170._0_8_ = "filter_index.LookupFilterRange(block_index->nHeight, block_index, filters)";
    local_170._8_8_ = "";
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_0113a070;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_288 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_280 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    local_200 = local_170;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_150,(lazy_ostream *)&local_218,1,0,WARN,_cVar8,
               (size_t)&local_288,0x30);
    boost::detail::shared_count::~shared_count(asStack_140);
    local_298 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_290 = "";
    local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar6;
    msg_02.m_begin = pvVar5;
    file_02.m_end = &DAT_00000032;
    file_02.m_begin = (iterator)&local_298;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
               msg_02);
    local_150[0] = (class_property<bool>)
                   BlockFilterIndex::LookupFilterHashRange
                             (filter_index,block_index->nHeight,block_index,&filter_hashes);
    local_150._8_8_ = (element_type *)0x0;
    asStack_140[0].pi_ = (sp_counted_base *)0x0;
    local_170._0_8_ =
         "filter_index.LookupFilterHashRange(block_index->nHeight, block_index, filter_hashes)";
    local_170._8_8_ = "";
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_0113a070;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_2b0 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    local_200 = local_170;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_150,(lazy_ostream *)&local_218,1,0,WARN,_cVar8,
               (size_t)&local_2b8,0x32);
    boost::detail::shared_count::~shared_count(asStack_140);
    local_2c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_2c0 = "";
    local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = pvVar6;
    msg_03.m_begin = pvVar5;
    file_03.m_end = (iterator)0x34;
    file_03.m_begin = (iterator)&local_2c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
               msg_03);
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_01139f30;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_200 = "";
    local_2e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_2e0 = "";
    local_150._0_8_ =
         ((long)filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x68;
    pvVar5 = local_150;
    local_170[0] = '\x01';
    local_170[1] = '\0';
    local_170[2] = '\0';
    local_170[3] = '\0';
    pvVar6 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&local_218,&local_2e8,0x34,1,2,pvVar5,"filters.size()",local_170,"1U");
    local_2f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_2f0 = "";
    local_308 = &boost::unit_test::basic_cstring<char_const>::null;
    local_300 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar5;
    msg_04.m_begin = pvVar6;
    file_04.m_end = (iterator)0x35;
    file_04.m_begin = (iterator)&local_2f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_308,
               msg_04);
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_01139f30;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_200 = "";
    local_318 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_310 = "";
    local_150._0_8_ =
         (long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start >> 5;
    pvVar5 = local_150;
    local_170._0_4_ = 1;
    pvVar6 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&local_218,&local_318,0x35,1,2,pvVar5,"filter_hashes.size()",local_170,"1U");
    local_328 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_320 = "";
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar5;
    msg_05.m_begin = pvVar6;
    file_05.m_end = (iterator)0x37;
    file_05.m_begin = (iterator)&local_328;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
               msg_05);
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_01139f30;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_200 = "";
    local_348 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_340 = "";
    BlockFilter::GetHash((uint256 *)local_150,&filter);
    BlockFilter::GetHash((uint256 *)local_170,&expected_filter);
    pvVar6 = (iterator)0x2;
    pvVar5 = local_150;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&local_218,&local_348,0x37,1,2,pvVar5,"filter.GetHash()",(uint256 *)local_170,
               "expected_filter.GetHash()");
    local_358 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_350 = "";
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    local_360 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar5;
    msg_06.m_begin = pvVar6;
    file_06.m_end = (iterator)0x38;
    file_06.m_begin = (iterator)&local_358;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_368,
               msg_06);
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_01139f30;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_200 = "";
    local_378 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_370 = "";
    BlockFilter::ComputeHeader((uint256 *)local_150,&expected_filter,last_header);
    pvVar5 = (iterator)0x2;
    puVar7 = &filter_header;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&local_218,&local_378,0x38,1,2,puVar7,"filter_header",(uint256 *)local_150,
               "expected_filter.ComputeHeader(last_header)");
    local_388 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_380 = "";
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = (iterator)puVar7;
    msg_07.m_begin = pvVar5;
    file_07.m_end = (iterator)0x39;
    file_07.m_begin = (iterator)&local_388;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_398,
               msg_07);
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_01139f30;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_200 = "";
    local_3a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_3a0 = "";
    BlockFilter::GetHash
              ((uint256 *)local_150,
               filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
               super__Vector_impl_data._M_start);
    BlockFilter::GetHash((uint256 *)local_170,&expected_filter);
    pvVar6 = (iterator)0x2;
    pvVar5 = local_150;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&local_218,&local_3a8,0x39,1,2,pvVar5,"filters[0].GetHash()",(uint256 *)local_170,
               "expected_filter.GetHash()");
    local_3b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_3b0 = "";
    local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_08.m_end = pvVar5;
    msg_08.m_begin = pvVar6;
    file_08.m_end = (iterator)0x3a;
    file_08.m_begin = (iterator)&local_3b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3c8,
               msg_08);
    puVar2 = filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
    local_218._0_8_ = &PTR__lazy_ostream_01139f30;
    local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_200 = "";
    local_3d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_3d0 = "";
    BlockFilter::GetHash((uint256 *)local_150,&expected_filter);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&local_218,&local_3d8,0x3a,1,2,puVar2,"filter_hashes[0]",(uint256 *)local_150,
               "expected_filter.GetHash()");
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::clear(&filters);
    if (filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start) {
      filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish =
           filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    *(undefined8 *)((last_header->super_base_blob<256U>).m_data._M_elems + 0x10) =
         filter_header.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((last_header->super_base_blob<256U>).m_data._M_elems + 0x18) =
         filter_header.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(last_header->super_base_blob<256U>).m_data._M_elems =
         filter_header.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((last_header->super_base_blob<256U>).m_data._M_elems + 8) =
         filter_header.super_base_blob<256U>.m_data._M_elems._8_8_;
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              (&filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>);
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::~vector(&filters);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&filter.m_filter.m_encoded.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_178 = "";
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = in_R9;
    msg_09.m_begin = in_R8;
    file_09.m_end = (iterator)0x25;
    file_09.m_begin = (iterator)&local_180;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_190,
               msg_09);
    local_218._0_8_ = local_218._0_8_ & 0xffffffffffffff00;
    local_218.m_message.px = (element_type *)0x0;
    local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ = &filter_header;
    filter_header.super_base_blob<256U>.m_data._M_elems._8_8_ =
         filter_header.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    filter_header.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113ac38;
    filter_header.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    filter_header.super_base_blob<256U>.m_data._M_elems._24_8_ = anon_var_dwarf_33fb38;
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ = &block_index->nHeight;
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    filter._0_8_ = &PTR__lazy_ostream_0113abf8;
    local_1a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_198 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_218,(lazy_ostream *)&filter,1,1,WARN,_cVar8,(size_t)&local_1a0,0x25);
    boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&expected_filter.m_filter.m_encoded.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SUB81(*(long *)(in_FS_OFFSET + 0x28),0);
  }
  __stack_chk_fail();
}

Assistant:

static bool CheckFilterLookups(BlockFilterIndex& filter_index, const CBlockIndex* block_index,
                               uint256& last_header, const BlockManager& blockman)
{
    BlockFilter expected_filter;
    if (!ComputeFilter(filter_index.GetFilterType(), *block_index, expected_filter, blockman)) {
        BOOST_ERROR("ComputeFilter failed on block " << block_index->nHeight);
        return false;
    }

    BlockFilter filter;
    uint256 filter_header;
    std::vector<BlockFilter> filters;
    std::vector<uint256> filter_hashes;

    BOOST_CHECK(filter_index.LookupFilter(block_index, filter));
    BOOST_CHECK(filter_index.LookupFilterHeader(block_index, filter_header));
    BOOST_CHECK(filter_index.LookupFilterRange(block_index->nHeight, block_index, filters));
    BOOST_CHECK(filter_index.LookupFilterHashRange(block_index->nHeight, block_index,
                                                   filter_hashes));

    BOOST_CHECK_EQUAL(filters.size(), 1U);
    BOOST_CHECK_EQUAL(filter_hashes.size(), 1U);

    BOOST_CHECK_EQUAL(filter.GetHash(), expected_filter.GetHash());
    BOOST_CHECK_EQUAL(filter_header, expected_filter.ComputeHeader(last_header));
    BOOST_CHECK_EQUAL(filters[0].GetHash(), expected_filter.GetHash());
    BOOST_CHECK_EQUAL(filter_hashes[0], expected_filter.GetHash());

    filters.clear();
    filter_hashes.clear();
    last_header = filter_header;
    return true;
}